

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O2

int UseHealthItems(TArray<AInventory_*,_AInventory_*> *Items,int *saveHealth)

{
  int *piVar1;
  AInventory **ppAVar2;
  AInventory *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int index;
  ulong uVar9;
  
  iVar8 = 0;
LAB_004a027f:
  do {
    iVar5 = iVar8;
    if (((ulong)Items->Count == 0) || (*saveHealth < 1)) {
      return iVar5;
    }
    ppAVar2 = Items->Array;
    iVar6 = 0;
    uVar9 = 0xffffffff;
    for (uVar7 = 0; Items->Count != uVar7; uVar7 = uVar7 + 1) {
      iVar8 = (ppAVar2[uVar7]->super_AActor).health;
      if (iVar6 < iVar8) {
        uVar9 = uVar7 & 0xffffffff;
        iVar6 = iVar8;
      }
    }
    iVar4 = (*saveHealth + iVar6 + -1) / iVar6;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    iVar8 = iVar4 * iVar6 + iVar5;
    iVar4 = iVar4 + 1;
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) goto LAB_004a027f;
      iVar5 = iVar5 + iVar6;
      *saveHealth = *saveHealth - iVar6;
      pAVar3 = ppAVar2[(int)(uint)uVar9];
      piVar1 = &pAVar3->Amount;
      *piVar1 = *piVar1 + -1;
    } while (*piVar1 != 0);
    (*(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])();
    TArray<AInventory_*,_AInventory_*>::Delete(Items,(uint)uVar9);
    iVar8 = iVar5;
  } while( true );
}

Assistant:

static int UseHealthItems(TArray<AInventory *> &Items, int &saveHealth)
{
	int saved = 0;

	while (Items.Size() > 0 && saveHealth > 0)
	{
		int maxhealth = 0;
		int index = -1;

		// Find the largest item in the list
		for(unsigned i = 0; i < Items.Size(); i++)
		{
			if (Items[i]->health > maxhealth)
			{
				index = i;
				maxhealth = Items[i]->health;
			}
		}

		// Now apply the health items, using the same logic as Heretic and Hexen.
		int count = (saveHealth + maxhealth-1) / maxhealth;
		for(int i = 0; i < count; i++)
		{
			saved += maxhealth;
			saveHealth -= maxhealth;
			if (--Items[index]->Amount == 0)
			{
				Items[index]->DepleteOrDestroy ();
				Items.Delete(index);
				break;
			}
		}
	}
	return saved;
}